

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

char * google::protobuf::ParseLenDelim
                 (int field_number,FieldDescriptor *field,Message *msg,Reflection *reflection,
                 char *ptr,ParseContext *ctx)

{
  MessageFactory *factory;
  int iVar1;
  void *pvVar2;
  Message *msg_00;
  string *s;
  char *pcVar3;
  LogMessage *pLVar4;
  anon_enum_32 utf8_level;
  anon_class_32_4_7f07c394 parse_string;
  char *field_name;
  anon_enum_32 local_e4;
  FieldDescriptor *local_e0;
  anon_class_32_4_7f07c394 local_d8;
  char *local_b8;
  string local_b0;
  string local_90;
  FieldDescriptor *local_70;
  code *local_68 [7];
  
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_68[0] = FieldDescriptor::TypeOnceInit;
    local_d8.ptr = (char *)field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),local_68,(FieldDescriptor **)&local_d8);
  }
  if (*(int *)(internal::WireFormatLite::kWireTypeForFieldType + (ulong)*(uint *)(field + 0x38) * 4)
      != 2) {
    pcVar3 = ParsePackedField(field,msg,reflection,ptr,ctx);
    return pcVar3;
  }
  local_d8.utf8_level = &local_e4;
  local_e4 = kNone;
  local_d8.field_name = &local_b8;
  local_b8 = (char *)0x0;
  local_d8.ptr = ptr;
  local_d8.ctx = ctx;
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_68[0] = FieldDescriptor::TypeOnceInit;
    local_e0 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),local_68,&local_e0);
  }
  iVar1 = *(int *)(field + 0x38);
  if (iVar1 != 0xc) {
    if (iVar1 == 0xb) {
      factory = (ctx->data_).factory;
      if (*(int *)(field + 0x3c) == 3) {
        msg_00 = Reflection::AddMessage(reflection,msg,field,factory);
      }
      else {
        msg_00 = Reflection::MutableMessage(reflection,msg,field,factory);
      }
      pcVar3 = internal::ParseContext::ParseMessage(ctx,msg_00,ptr);
      return pcVar3;
    }
    if (iVar1 != 9) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_68,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message.cc"
                 ,0x16c);
      pLVar4 = internal::LogMessage::operator<<
                         ((LogMessage *)local_68,"Wrong type for length delim ");
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_e0 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
        local_70 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_e0,
                   &local_70);
      }
      pLVar4 = internal::LogMessage::operator<<(pLVar4,*(int *)(field + 0x38));
      internal::LogFinisher::operator=((LogFinisher *)&local_e0,pLVar4);
      internal::LogMessage::~LogMessage((LogMessage *)local_68);
      return (char *)0x0;
    }
    local_e4 = (*(int *)(*(long *)(field + 0x28) + 0x3c) == 3) + kVerify;
    local_b8 = (char *)**(undefined8 **)(field + 8);
  }
  if (*(int *)(field + 0x3c) == 3) {
    iVar1 = Reflection::FieldSize(reflection,msg,field);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,anon_var_dwarf_3d3289 + 0x11);
    Reflection::AddString(reflection,msg,field,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    pvVar2 = Reflection::MutableRawRepeatedString(reflection,msg,field,true);
    s = *(string **)(*(long *)((long)pvVar2 + 0x10) + 8 + (long)iVar1 * 8);
  }
  else {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,anon_var_dwarf_3d3289 + 0x11);
    Reflection::SetString(reflection,msg,field,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    s = Reflection::GetStringReference(reflection,msg,field,(string *)0x0);
  }
  pcVar3 = ParseLenDelim::anon_class_32_4_7f07c394::operator()(&local_d8,s);
  return pcVar3;
}

Assistant:

const char* ParseLenDelim(int field_number, const FieldDescriptor* field,
                          Message* msg, const Reflection* reflection,
                          const char* ptr, internal::ParseContext* ctx) {
  if (WireFormat::WireTypeForFieldType(field->type()) !=
      WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    GOOGLE_DCHECK(field->is_packable());
    return ParsePackedField(field, msg, reflection, ptr, ctx);
  }
  enum { kNone = 0, kVerify, kStrict } utf8_level = kNone;
  const char* field_name = nullptr;
  auto parse_string = [ptr, ctx, &utf8_level,
                       &field_name](std::string* s) -> const char* {
    switch (utf8_level) {
      case kNone:
        return internal::InlineGreedyStringParser(s, ptr, ctx);
      case kVerify:
        return internal::InlineGreedyStringParserUTF8Verify(s, ptr, ctx,
                                                            field_name);
      case kStrict:
        return internal::InlineGreedyStringParserUTF8(s, ptr, ctx, field_name);
    }
    GOOGLE_LOG(FATAL) << "Should not reach here";
    return nullptr;  // Make compiler happy
  };
  switch (field->type()) {
    case FieldDescriptor::TYPE_STRING: {
      bool enforce_utf8 = true;
      bool utf8_verification = true;
      if (enforce_utf8 &&
          field->file()->syntax() == FileDescriptor::SYNTAX_PROTO3) {
        utf8_level = kStrict;
      } else if (utf8_verification) {
        utf8_level = kVerify;
      }
      field_name = field->full_name().c_str();
      PROTOBUF_FALLTHROUGH_INTENDED;
    }
    case FieldDescriptor::TYPE_BYTES: {
      if (field->is_repeated()) {
        int index = reflection->FieldSize(*msg, field);
        // Add new empty value.
        reflection->AddString(msg, field, "");
        if (field->options().ctype() == FieldOptions::STRING ||
            field->is_extension()) {
          auto object =
              reflection->MutableRepeatedPtrField<std::string>(msg, field)
                  ->Mutable(index);
          return parse_string(object);
        } else {
          auto object =
              reflection->MutableRepeatedPtrField<std::string>(msg, field)
                  ->Mutable(index);
          return parse_string(object);
        }
      } else {
        // Clear value and make sure it's set.
        reflection->SetString(msg, field, "");
        if (field->options().ctype() == FieldOptions::STRING ||
            field->is_extension()) {
          // HACK around inability to get mutable_string in reflection
          std::string* object = &const_cast<std::string&>(
              reflection->GetStringReference(*msg, field, nullptr));
          return parse_string(object);
        } else {
          // HACK around inability to get mutable_string in reflection
          std::string* object = &const_cast<std::string&>(
              reflection->GetStringReference(*msg, field, nullptr));
          return parse_string(object);
        }
      }
      GOOGLE_LOG(FATAL) << "No other type than string supported";
    }
    case FieldDescriptor::TYPE_MESSAGE: {
      Message* object;
      if (field->is_repeated()) {
        object = reflection->AddMessage(msg, field, ctx->data().factory);
      } else {
        object = reflection->MutableMessage(msg, field, ctx->data().factory);
      }
      return ctx->ParseMessage(object, ptr);
    }
    default:
      GOOGLE_LOG(FATAL) << "Wrong type for length delim " << field->type();
  }
  return nullptr;  // Make compiler happy.
}